

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-expression.c
# Opt level: O0

int32_t expression_evaluate(expression_t *expression)

{
  int32_t local_1c;
  ulong uStack_18;
  int32_t value;
  size_t i;
  expression_t *expression_local;
  
  local_1c = 0;
  if (expression->base_value != (expression_base_value_f)0x0) {
    local_1c = (*expression->base_value)();
  }
  for (uStack_18 = 0; uStack_18 < expression->operation_count; uStack_18 = uStack_18 + 1) {
    switch(expression->operations[uStack_18].operator) {
    case '\x01':
      local_1c = expression->operations[uStack_18].operand + local_1c;
      break;
    case '\x02':
      local_1c = local_1c - expression->operations[uStack_18].operand;
      break;
    case '\x03':
      local_1c = expression->operations[uStack_18].operand * local_1c;
      break;
    case '\x04':
      local_1c = local_1c / (int)expression->operations[uStack_18].operand;
      break;
    case '\x05':
      local_1c = -local_1c;
    }
  }
  return local_1c;
}

Assistant:

int32_t expression_evaluate(expression_t const * const expression)
{
	size_t i;
	int32_t value = 0;

	if (expression->base_value != NULL)
		value = expression->base_value();

	for (i = 0; i < expression->operation_count; i++) {
		switch (expression->operations[i].operator) {
			case OPERATOR_ADD:
				value += expression->operations[i].operand;
				break;
			case OPERATOR_SUB:
				value -= expression->operations[i].operand;
				break;
			case OPERATOR_MUL:
				value *= expression->operations[i].operand;
				break;
			case OPERATOR_DIV:
				value /= expression->operations[i].operand;
				break;
			case OPERATOR_NEG:
				value = -value;
				break;
			default:
				break;
		}
	}

	return value;
}